

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void CleanSpaces(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  uint uVar5;
  Node *pNVar6;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pNVar2 = node->next;
    BVar4 = prvTidynodeIsText(node);
    if (((((BVar4 != no) && (BVar4 = prvTidynodeIsText(node), BVar4 != no)) &&
         (pNVar3 = node->parent, pNVar3->type != DocTypeTag)) &&
        (BVar4 = IsPreDescendant(node), BVar4 == no)) &&
       ((pNVar3->tag == (Dict *)0x0 || (pNVar3->tag->parser != prvTidyParseScript)))) {
      pNVar6 = node->prev;
      if (pNVar6 == (Node *)0x0) {
        BVar4 = prvTidynodeHasCM(pNVar3,0x10);
        if (BVar4 != no) {
          pNVar6 = node->prev;
          if (pNVar6 != (Node *)0x0) goto LAB_0013f50d;
LAB_0013f527:
          if ((node->parent->prev != (Node *)0x0) ||
             (BVar4 = prvTidynodeHasCM(node->parent->parent,0x10), BVar4 != no)) goto LAB_0013f394;
        }
      }
      else if ((pNVar6->tag == (Dict *)0x0) || (pNVar6->tag->id != TidyTag_BR)) {
LAB_0013f50d:
        BVar4 = prvTidynodeHasCM(pNVar6,0x10);
        if ((BVar4 != no) || (BVar4 = prvTidynodeIsElement(node->prev), BVar4 == no)) {
          if (node->prev == (Node *)0x0) goto LAB_0013f527;
          goto LAB_0013f394;
        }
      }
      uVar5 = node->start;
      while ((uVar5 < node->end &&
             (BVar4 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar5]), BVar4 != no))) {
        uVar5 = node->start + 1;
        node->start = uVar5;
      }
    }
LAB_0013f394:
    BVar4 = prvTidynodeIsText(node);
    if ((((BVar4 != no) && (BVar4 = prvTidynodeIsText(node), BVar4 != no)) &&
        (pNVar3 = node->parent, pNVar3->type != DocTypeTag)) &&
       ((BVar4 = IsPreDescendant(node), BVar4 == no &&
        ((pNVar3->tag == (Dict *)0x0 || (pNVar3->tag->parser != prvTidyParseScript)))))) {
      pNVar6 = node->next;
      if (pNVar6 == (Node *)0x0) {
        BVar4 = prvTidynodeHasCM(pNVar3,0x10);
        if ((BVar4 == no) ||
           ((pNVar3 = node->parent->next, pNVar3 != (Node *)0x0 &&
            (BVar4 = prvTidynodeHasCM(pNVar3,0x10), BVar4 == no)))) goto LAB_0013f576;
      }
      else if (((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_BR)) ||
              ((BVar4 = prvTidynodeHasCM(pNVar6,0x10), BVar4 == no &&
               (((pNVar6->type | CommentTag) == StartEndTag ||
                (((BVar4 = prvTidynodeIsText(pNVar6), BVar4 != no && (pNVar6->start < pNVar6->end))
                 && (BVar4 = prvTidyIsWhite((int)doc->lexer->lexbuf[pNVar6->start]), BVar4 != no))))
               )))) {
LAB_0013f576:
        uVar5 = node->end;
        while ((node->start < uVar5 &&
               (BVar4 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar5 - 1]), BVar4 != no))) {
          uVar5 = node->end - 1;
          node->end = uVar5;
        }
      }
    }
    BVar4 = prvTidynodeIsText(node);
    if ((BVar4 == no) || (node->start < node->end)) {
      ppNVar1 = &node->content;
      node = pNVar2;
      if (*ppNVar1 != (Node *)0x0) {
        CleanSpaces(doc,*ppNVar1);
      }
    }
    else {
      prvTidyRemoveNode(node);
      prvTidyFreeNode(doc,node);
      node = pNVar2;
    }
  } while( true );
}

Assistant:

static void CleanSpaces(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node) && CleanLeadingWhitespace(doc, node))
            while (node->start < node->end && TY_(IsWhite)(doc->lexer->lexbuf[node->start]))
                ++(node->start);

        if (TY_(nodeIsText)(node) && CleanTrailingWhitespace(doc, node))
            while (node->end > node->start && TY_(IsWhite)(doc->lexer->lexbuf[node->end - 1]))
                --(node->end);

        if (TY_(nodeIsText)(node) && !(node->start < node->end))
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;

            continue;
        }

        if (node->content)
            CleanSpaces(doc, node->content);

        node = next;
    }
}